

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_DetachArrayBuffer(JSContext *ctx,JSValue obj)

{
  long lVar1;
  JSValue obj_00;
  undefined4 *puVar2;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  long in_RDI;
  JSObject *p;
  JSTypedArray *ta;
  list_head *el;
  JSArrayBuffer *abuf;
  undefined4 *local_28;
  
  obj_00.tag = in_RDX;
  obj_00.u.float64 = in_RSI.float64;
  puVar2 = (undefined4 *)JS_GetOpaque(obj_00,0x13);
  if ((puVar2 != (undefined4 *)0x0) && (*(char *)(puVar2 + 1) == '\0')) {
    if (*(long *)(puVar2 + 10) != 0) {
      (**(code **)(puVar2 + 10))
                (*(undefined8 *)(in_RDI + 0x18),*(undefined8 *)(puVar2 + 8),
                 *(undefined8 *)(puVar2 + 2));
    }
    *(undefined8 *)(puVar2 + 2) = 0;
    *puVar2 = 0;
    *(undefined1 *)(puVar2 + 1) = 1;
    for (local_28 = *(undefined4 **)(puVar2 + 6); local_28 != puVar2 + 4;
        local_28 = *(undefined4 **)(local_28 + 2)) {
      lVar1 = *(long *)(local_28 + 4);
      if (*(short *)(lVar1 + 6) != 0x1e) {
        *(undefined4 *)(lVar1 + 0x40) = 0;
        *(undefined8 *)(lVar1 + 0x38) = 0;
      }
    }
  }
  return;
}

Assistant:

void JS_DetachArrayBuffer(JSContext *ctx, JSValueConst obj)
{
    JSArrayBuffer *abuf = JS_GetOpaque(obj, JS_CLASS_ARRAY_BUFFER);
    struct list_head *el;

    if (!abuf || abuf->detached)
        return;
    if (abuf->free_func)
        abuf->free_func(ctx->rt, abuf->opaque, abuf->data);
    abuf->data = NULL;
    abuf->byte_length = 0;
    abuf->detached = TRUE;

    list_for_each(el, &abuf->array_list) {
        JSTypedArray *ta;
        JSObject *p;

        ta = list_entry(el, JSTypedArray, link);
        p = ta->obj;
        /* Note: the typed array length and offset fields are not modified */
        if (p->class_id != JS_CLASS_DATAVIEW) {
            p->u.array.count = 0;
            p->u.array.u.ptr = NULL;
        }
    }
}